

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deque.hpp
# Opt level: O3

void __thiscall
ft::deque<char,_ft::allocator<char>_>::push_back
          (deque<char,_ft::allocator<char>_> *this,value_type_conflict *val)

{
  map_pointer ppvVar1;
  pointer pvVar2;
  
  if ((this->m_finish).m_cur + 1 == (this->m_finish).m_last) {
    ppvVar1 = (this->m_finish).m_node;
    if (ppvVar1 == this->m_map + (this->m_map_size - 1)) {
      realloc(this,val,this->m_map_size);
      ppvVar1 = (this->m_finish).m_node;
    }
    if (ppvVar1[1] == (pointer)0x0) {
      pvVar2 = (pointer)operator_new(0x40);
      (this->m_finish).m_node[1] = pvVar2;
      this->m_chunks = this->m_chunks + 1;
    }
  }
  *(this->m_finish).m_cur = *val;
  pvVar2 = (this->m_finish).m_cur + 1;
  (this->m_finish).m_cur = pvVar2;
  if (pvVar2 == (this->m_finish).m_last) {
    ppvVar1 = (this->m_finish).m_node;
    (this->m_finish).m_node = ppvVar1 + 1;
    pvVar2 = ppvVar1[1];
    (this->m_finish).m_first = pvVar2;
    (this->m_finish).m_last = pvVar2 + 0x40;
    (this->m_finish).m_cur = pvVar2;
  }
  this->m_size = this->m_size + 1;
  return;
}

Assistant:

void push_back(value_type const & val) {
		if (this->m_finish.m_cur + 1 == this->m_finish.m_last) {
			if (this->m_finish.m_node == this->m_map + this->m_map_size - 1) {
				this->realloc();
			}
			if (*(this->m_finish.m_node + 1) == NULL) {
				*(this->m_finish.m_node + 1) = this->m_alloc.allocate(this->chunk_size());
				++this->m_chunks;
			}
		}
		this->m_alloc.construct(this->m_finish.m_cur, val);
		++this->m_finish;
		++this->m_size;
	}